

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

sxi32 HashmapGrowBucket(jx9_hashmap *pMap)

{
  jx9_hashmap_node **pChunk;
  jx9_hashmap_node *pjVar1;
  sxu32 sVar2;
  jx9_hashmap_node **ppjVar3;
  jx9_hashmap_node **ppjVar4;
  uint uVar5;
  jx9_hashmap_node **ppjVar6;
  int iVar7;
  sxu32 sVar8;
  
  iVar7 = 0;
  if (pMap->nSize * 3 <= pMap->nEntry) {
    pChunk = pMap->apBucket;
    sVar2 = pMap->nSize * 2;
    sVar8 = 0x10;
    if (sVar2 != 0) {
      sVar8 = sVar2;
    }
    uVar5 = sVar8 * 8;
    ppjVar3 = (jx9_hashmap_node **)SyMemBackendAlloc(&pMap->pVm->sAllocator,uVar5);
    if (ppjVar3 == (jx9_hashmap_node **)0x0) {
      iVar7 = -(uint)(pMap->nSize == 0);
    }
    else {
      if (uVar5 != 0) {
        ppjVar4 = (jx9_hashmap_node **)((long)ppjVar3 + (ulong)uVar5);
        ppjVar6 = ppjVar3;
        do {
          *(undefined1 *)ppjVar6 = 0;
          if (ppjVar4 <= (jx9_hashmap_node **)((long)ppjVar6 + 1)) break;
          *(undefined1 *)((long)ppjVar6 + 1) = 0;
          if (ppjVar4 <= (jx9_hashmap_node **)((long)ppjVar6 + 2)) break;
          *(undefined1 *)((long)ppjVar6 + 2) = 0;
          if (ppjVar4 <= (jx9_hashmap_node **)((long)ppjVar6 + 3)) break;
          *(undefined1 *)((long)ppjVar6 + 3) = 0;
          ppjVar6 = (jx9_hashmap_node **)((long)ppjVar6 + 4);
        } while (ppjVar6 < ppjVar4);
      }
      pMap->apBucket = ppjVar3;
      pMap->nSize = sVar8;
      iVar7 = 0;
      if (pChunk != (jx9_hashmap_node **)0x0) {
        sVar2 = pMap->nEntry;
        if (sVar2 != 0) {
          ppjVar3 = &pMap->pFirst;
          do {
            pjVar1 = *ppjVar3;
            pjVar1->pNextCollide = (jx9_hashmap_node *)0x0;
            pjVar1->pPrevCollide = (jx9_hashmap_node *)0x0;
            uVar5 = pjVar1->nHash & sVar8 - 1;
            ppjVar3 = pMap->apBucket;
            if (ppjVar3[uVar5] != (jx9_hashmap_node *)0x0) {
              pjVar1->pNextCollide = ppjVar3[uVar5];
              ppjVar3[uVar5]->pPrevCollide = pjVar1;
            }
            ppjVar3[uVar5] = pjVar1;
            ppjVar3 = &pjVar1->pPrev;
            sVar2 = sVar2 - 1;
          } while (sVar2 != 0);
        }
        SyMemBackendFree(&pMap->pVm->sAllocator,pChunk);
      }
    }
  }
  return iVar7;
}

Assistant:

static sxi32 HashmapGrowBucket(jx9_hashmap *pMap)
{
	if( pMap->nEntry >= pMap->nSize * HASHMAP_FILL_FACTOR ){
		jx9_hashmap_node **apOld = pMap->apBucket;
		jx9_hashmap_node *pEntry, **apNew;
		sxu32 nNew = pMap->nSize << 1;
		sxu32 nBucket;
		sxu32 n;
		if( nNew < 1 ){
			nNew = 16;
		}
		/* Allocate a new bucket */
		apNew = (jx9_hashmap_node **)SyMemBackendAlloc(&pMap->pVm->sAllocator, nNew * sizeof(jx9_hashmap_node *));
		if( apNew == 0 ){
			if( pMap->nSize < 1 ){
				return SXERR_MEM; /* Fatal */
			}
			/* Not so fatal here, simply a performance hit */
			return SXRET_OK;
		}
		/* Zero the table */
		SyZero((void *)apNew, nNew * sizeof(jx9_hashmap_node *));
		/* Reflect the change */
		pMap->apBucket = apNew;
		pMap->nSize = nNew;
		if( apOld == 0 ){
			/* First allocated table [i.e: no entry], return immediately */
			return SXRET_OK;
		}
		/* Rehash old entries */
		pEntry = pMap->pFirst;
		n = 0;
		for( ;; ){
			if( n >= pMap->nEntry ){
				break;
			}
			/* Clear the old collision link */
			pEntry->pNextCollide = pEntry->pPrevCollide = 0;
			/* Link to the new bucket */
			nBucket = pEntry->nHash & (nNew - 1);
			if( pMap->apBucket[nBucket] != 0 ){
				pEntry->pNextCollide = pMap->apBucket[nBucket];
				pMap->apBucket[nBucket]->pPrevCollide = pEntry;
			}
			pMap->apBucket[nBucket] = pEntry;
			/* Point to the next entry */
			pEntry = pEntry->pPrev; /* Reverse link */
			n++;
		}
		/* Free the old table */
		SyMemBackendFree(&pMap->pVm->sAllocator, (void *)apOld);
	}
	return SXRET_OK;
}